

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O3

void __thiscall cmGlobalGenerator::Configure(cmGlobalGenerator *this)

{
  cmake *pcVar1;
  pointer puVar2;
  char *__s;
  undefined *puVar3;
  GlobalTargetInfo *pGVar4;
  bool bVar5;
  string *psVar6;
  tuple<cmMakefile_*,_std::default_delete<cmMakefile>_> this_00;
  ostream *poVar7;
  undefined **ppuVar8;
  GlobalTargetInfo *globalTarget;
  undefined1 gti [8];
  unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *mf;
  pointer puVar9;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  __single_object dirMfu;
  string f;
  vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  globalTargets;
  cmStateSnapshot snapshot;
  char num [100];
  __uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_> local_290;
  string local_288;
  string local_268;
  size_t local_248;
  char *local_240;
  undefined1 local_238 [8];
  GlobalTargetInfo *pGStack_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228 [6];
  ios_base local_1c8 [272];
  cmStateSnapshot local_b8;
  char local_98 [104];
  
  this->FirstTimeProgress = 0.0;
  ClearGeneratorMembers(this);
  this->NextDeferId = 0;
  pcVar1 = this->CMakeInstance;
  local_b8.Position.Position = (pcVar1->CurrentSnapshot).Position.Position;
  local_b8.State = (pcVar1->CurrentSnapshot).State;
  local_b8.Position.Tree = (pcVar1->CurrentSnapshot).Position.Tree;
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_238,&local_b8);
  psVar6 = cmake::GetHomeDirectory_abi_cxx11_(this->CMakeInstance);
  cmStateDirectory::SetCurrentSource((cmStateDirectory *)local_238,psVar6);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_238,&local_b8);
  psVar6 = cmake::GetHomeOutputDirectory_abi_cxx11_(this->CMakeInstance);
  cmStateDirectory::SetCurrentBinary((cmStateDirectory *)local_238,psVar6);
  this_00.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
  super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>)operator_new(0x7f8);
  cmMakefile::cmMakefile
            ((cmMakefile *)
             this_00.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
             super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,this,&local_b8);
  local_290._M_t.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
  super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl =
       (tuple<cmMakefile_*,_std::default_delete<cmMakefile>_>)
       (tuple<cmMakefile_*,_std::default_delete<cmMakefile>_>)
       this_00.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
       super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl;
  std::
  vector<std::unique_ptr<cmMakefile,std::default_delete<cmMakefile>>,std::allocator<std::unique_ptr<cmMakefile,std::default_delete<cmMakefile>>>>
  ::emplace_back<std::unique_ptr<cmMakefile,std::default_delete<cmMakefile>>>
            ((vector<std::unique_ptr<cmMakefile,std::default_delete<cmMakefile>>,std::allocator<std::unique_ptr<cmMakefile,std::default_delete<cmMakefile>>>>
              *)&this->Makefiles,
             (unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *)&local_290);
  cmMakefile::SetRecursionDepth
            ((cmMakefile *)
             this_00.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
             super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,this->RecursionDepth);
  IndexMakefile(this,(cmMakefile *)
                     this_00.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
                     super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl);
  psVar6 = cmake::GetHomeOutputDirectory_abi_cxx11_(this->CMakeInstance);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&this->BinaryDirectories,psVar6);
  this->ConfigureDoneCMP0026AndCMP0024 = false;
  cmMakefile::Configure
            ((cmMakefile *)
             this_00.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
             super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl);
  cmMakefile::EnforceDirectoryLevelRules
            ((cmMakefile *)
             this_00.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
             super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl);
  this->ConfigureDoneCMP0026AndCMP0024 = true;
  local_238 = (undefined1  [8])0x0;
  pGStack_230 = (GlobalTargetInfo *)0x0;
  local_228[0]._M_allocated_capacity = (cmState *)0x0;
  CreateDefaultGlobalTargets
            (this,(vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
                   *)local_238);
  puVar2 = (this->Makefiles).
           super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar9 = (this->Makefiles).
                super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pGVar4 = pGStack_230, gti = local_238,
      puVar9 != puVar2; puVar9 = puVar9 + 1) {
    for (; gti != (undefined1  [8])pGVar4; gti = (undefined1  [8])((long)gti + 0xa0)) {
      CreateGlobalTarget(this,(GlobalTargetInfo *)gti,
                         (puVar9->_M_t).
                         super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
                         super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
                         super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl);
    }
  }
  std::
  vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  ::~vector((vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
             *)local_238);
  snprintf(local_98,100,"%d",
           (ulong)((long)(this->Makefiles).
                         super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->Makefiles).
                        super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) >> 3);
  pcVar1 = this->CMakeInstance;
  local_238 = (undefined1  [8])local_228;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_238,"CMAKE_NUMBER_OF_MAKEFILES","");
  cmake::AddCacheEntry(pcVar1,(string *)local_238,local_98,"number of local generators",4);
  if (local_238 != (undefined1  [8])local_228) {
    operator_delete((void *)local_238,(ulong)(local_228[0]._M_allocated_capacity + 1));
  }
  if (this->CMakeInstance->CurrentWorkingMode == NORMAL_MODE) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
    if (((cmSystemTools::s_ErrorOccurred != false) || (cmSystemTools::s_FatalErrorOccurred != false)
        ) || (bVar5 = cmSystemTools::GetInterruptFlag(), bVar5)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_238,"Configuring incomplete, errors occurred!",0x28);
      ppuVar8 = &PTR_anon_var_dwarf_623a1c_0087b378;
      do {
        psVar6 = cmake::GetHomeOutputDirectory_abi_cxx11_(this->CMakeInstance);
        local_268._M_string_length = (size_type)(psVar6->_M_dataplus)._M_p;
        local_268._M_dataplus._M_p = (pointer)psVar6->_M_string_length;
        local_268.field_2._M_allocated_capacity = 0xc;
        local_268.field_2._8_8_ = (long)"**/CMakeFiles/" + 2;
        __s = ppuVar8[-1];
        local_248 = strlen(__s);
        views._M_len = 3;
        views._M_array = (iterator)&local_268;
        local_240 = __s;
        cmCatViews_abi_cxx11_(&local_288,views);
        bVar5 = cmsys::SystemTools::FileExists(&local_288);
        if (bVar5) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_238,"\nSee also \"",0xb);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_238,local_288._M_dataplus._M_p,
                              local_288._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\".",2);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_dataplus._M_p != &local_288.field_2) {
          operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
        }
        puVar3 = *ppuVar8;
        ppuVar8 = ppuVar8 + 1;
      } while (puVar3 != (undefined *)0x0);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_238,"Configuring done",0x10);
    }
    pcVar1 = this->CMakeInstance;
    std::__cxx11::stringbuf::str();
    cmake::UpdateProgress(pcVar1,&local_268,-1.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
    std::ios_base::~ios_base(local_1c8);
  }
  std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::~unique_ptr
            ((unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *)&local_290);
  return;
}

Assistant:

void cmGlobalGenerator::Configure()
{
  this->FirstTimeProgress = 0.0f;
  this->ClearGeneratorMembers();
  this->NextDeferId = 0;

  cmStateSnapshot snapshot = this->CMakeInstance->GetCurrentSnapshot();

  snapshot.GetDirectory().SetCurrentSource(
    this->CMakeInstance->GetHomeDirectory());
  snapshot.GetDirectory().SetCurrentBinary(
    this->CMakeInstance->GetHomeOutputDirectory());

  auto dirMfu = cm::make_unique<cmMakefile>(this, snapshot);
  auto* dirMf = dirMfu.get();
  this->Makefiles.push_back(std::move(dirMfu));
  dirMf->SetRecursionDepth(this->RecursionDepth);
  this->IndexMakefile(dirMf);

  this->BinaryDirectories.insert(
    this->CMakeInstance->GetHomeOutputDirectory());

  // now do it
  this->ConfigureDoneCMP0026AndCMP0024 = false;
  dirMf->Configure();
  dirMf->EnforceDirectoryLevelRules();

  this->ConfigureDoneCMP0026AndCMP0024 = true;

  // Put a copy of each global target in every directory.
  {
    std::vector<GlobalTargetInfo> globalTargets;
    this->CreateDefaultGlobalTargets(globalTargets);

    for (const auto& mf : this->Makefiles) {
      for (GlobalTargetInfo const& globalTarget : globalTargets) {
        this->CreateGlobalTarget(globalTarget, mf.get());
      }
    }
  }

  // update the cache entry for the number of local generators, this is used
  // for progress
  char num[100];
  snprintf(num, sizeof(num), "%d", static_cast<int>(this->Makefiles.size()));
  this->GetCMakeInstance()->AddCacheEntry("CMAKE_NUMBER_OF_MAKEFILES", num,
                                          "number of local generators",
                                          cmStateEnums::INTERNAL);

  if (this->CMakeInstance->GetWorkingMode() == cmake::NORMAL_MODE) {
    std::ostringstream msg;
    if (cmSystemTools::GetErrorOccurredFlag()) {
      msg << "Configuring incomplete, errors occurred!";
      const char* logs[] = { "CMakeOutput.log", "CMakeError.log", nullptr };
      for (const char** log = logs; *log; ++log) {
        std::string f = cmStrCat(this->CMakeInstance->GetHomeOutputDirectory(),
                                 "/CMakeFiles/", *log);
        if (cmSystemTools::FileExists(f)) {
          msg << "\nSee also \"" << f << "\".";
        }
      }
    } else {
      msg << "Configuring done";
    }
    this->CMakeInstance->UpdateProgress(msg.str(), -1);
  }
}